

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeysTool_test.cpp
# Opt level: O2

void __thiscall jbcoin::tests::ValidatorKeysTool_test::testCreateToken(ValidatorKeysTool_test *this)

{
  allocator local_2e9;
  anon_class_8_1_8991fb9c testToken;
  KeyType keyType;
  CoutRedirect coutRedirect;
  path keyFile;
  string expectedError;
  SecretKey local_278;
  string subdir;
  string expectedError_2;
  pair<jbcoin::PublicKey,_jbcoin::SecretKey> kp;
  KeyFileGuard g;
  stringstream coutCapture;
  
  std::__cxx11::string::string((string *)&coutCapture,"Create Token",(allocator *)&expectedError);
  beast::unit_test::suite::testcase_t::operator()
            (&(this->super_suite).testcase,(string *)&coutCapture,no_abort_on_fail);
  std::__cxx11::string::~string((string *)&coutCapture);
  std::__cxx11::stringstream::stringstream((stringstream *)&coutCapture);
  CoutRedirect::CoutRedirect(&coutRedirect,&coutCapture);
  std::__cxx11::string::string((string *)&subdir,"test_key_file",(allocator *)&expectedError);
  KeyFileGuard::KeyFileGuard(&g,&this->super_suite,&subdir);
  std::__cxx11::string::string((string *)&expectedError,(string *)&subdir);
  boost::filesystem::path::path((path *)&kp,"validator_keys.json");
  boost::filesystem::operator/(&keyFile,(path *)&expectedError,(path *)&kp);
  std::__cxx11::string::~string((string *)&kp);
  std::__cxx11::string::~string((string *)&expectedError);
  testToken.this = this;
  std::operator+(&expectedError,"Failed to open key file: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyFile);
  testCreateToken::anon_class_8_1_8991fb9c::operator()(&testToken,&keyFile,&expectedError);
  std::__cxx11::string::~string((string *)&expectedError);
  createKeyFile(&keyFile);
  std::__cxx11::string::string((string *)&expectedError,"",(allocator *)&kp);
  testCreateToken::anon_class_8_1_8991fb9c::operator()(&testToken,&keyFile,&expectedError);
  std::__cxx11::string::~string((string *)&expectedError);
  keyType = ed25519;
  randomSeed();
  generateKeyPair(&kp,ed25519,(Seed *)&expectedError);
  Seed::~Seed((Seed *)&expectedError);
  ValidatorKeys::ValidatorKeys((ValidatorKeys *)&expectedError,&keyType,&kp.second,0xfffffffe,false)
  ;
  ValidatorKeys::writeToFile((ValidatorKeys *)&expectedError,&keyFile);
  std::__cxx11::string::string
            ((string *)&expectedError_2,
             "Maximum number of tokens have already been generated.\nRevoke validator keys if previous token has been compromised."
             ,&local_2e9);
  testCreateToken::anon_class_8_1_8991fb9c::operator()(&testToken,&keyFile,&expectedError_2);
  std::__cxx11::string::~string((string *)&expectedError_2);
  SecretKey::~SecretKey(&local_278);
  SecretKey::~SecretKey(&kp.second);
  createRevocation(&keyFile);
  std::__cxx11::string::string
            ((string *)&expectedError,"Validator keys have been revoked.",(allocator *)&kp);
  testCreateToken::anon_class_8_1_8991fb9c::operator()(&testToken,&keyFile,&expectedError);
  std::__cxx11::string::~string((string *)&expectedError);
  std::__cxx11::string::~string((string *)&keyFile);
  KeyFileGuard::~KeyFileGuard(&g);
  std::__cxx11::string::~string((string *)&subdir);
  CoutRedirect::~CoutRedirect(&coutRedirect);
  std::__cxx11::stringstream::~stringstream((stringstream *)&coutCapture);
  return;
}

Assistant:

void
    testCreateToken ()
    {
        testcase ("Create Token");

        std::stringstream coutCapture;
        CoutRedirect coutRedirect {coutCapture};

        using namespace boost::filesystem;

        std::string const subdir = "test_key_file";
        KeyFileGuard const g (*this, subdir);
        path const keyFile = subdir / "validator_keys.json";

        auto testToken = [this](
            path const& keyFile,
            std::string const& expectedError)
        {
            try
            {
                createToken (keyFile);
                BEAST_EXPECT(expectedError.empty());
            }
            catch (std::exception const& e)
            {
                BEAST_EXPECT(e.what() == expectedError);
            }
        };

        {
            std::string const expectedError =
                "Failed to open key file: " + keyFile.string();
            testToken (keyFile, expectedError);
        }

        createKeyFile (keyFile);

        {
            std::string const expectedError = "";
            testToken (keyFile, expectedError);
        }
        {
            auto const keyType = KeyType::ed25519;
            auto const kp = generateKeyPair (keyType, randomSeed ());

            auto keys = ValidatorKeys (
                keyType,
                kp.second,
                std::numeric_limits<std::uint32_t>::max () - 1);

            keys.writeToFile (keyFile);
            std::string const expectedError =
                "Maximum number of tokens have already been generated.\n"
                "Revoke validator keys if previous token has been compromised.";
            testToken (keyFile, expectedError);
        }
        {
            createRevocation (keyFile);
            std::string const expectedError =
                "Validator keys have been revoked.";
            testToken (keyFile, expectedError);
        }
    }